

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O1

void __thiscall ThreadParser::addToCheckSum(ThreadParser *this,XMLCh *chars,XMLSize_t len)

{
  int iVar1;
  XMLCh XVar2;
  XMLSize_t i;
  XMLSize_t XVar3;
  XMLCh *pXVar4;
  
  if (len == 0xffffffffffffffff) {
    XVar2 = *chars;
    if (XVar2 == L'\0') {
      return;
    }
    iVar1 = this->fCheckSum;
    pXVar4 = chars + 1;
    do {
      iVar1 = iVar1 * 5 + (uint)(ushort)XVar2;
      XVar2 = *pXVar4;
      pXVar4 = pXVar4 + 1;
    } while (XVar2 != L'\0');
  }
  else {
    if (len == 0) {
      return;
    }
    iVar1 = this->fCheckSum;
    XVar3 = 0;
    do {
      iVar1 = (uint)(ushort)chars[XVar3] + iVar1 * 5;
      XVar3 = XVar3 + 1;
    } while (len != XVar3);
  }
  this->fCheckSum = iVar1;
  return;
}

Assistant:

void ThreadParser::addToCheckSum(const XMLCh *chars, XMLSize_t len)
{
    if (len == (XMLSize_t)-1)
    {
        // Null terminated string.
        while (*chars != 0)
        {
            fCheckSum = fCheckSum*5 + *chars;
            chars++;
        }
    }
    else
    {
        // String with character count.
        XMLSize_t i;
        for (i=0; i<len; i++)
            fCheckSum = fCheckSum*5 + chars[i];
    }
}